

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::utils::MakeVector
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *input
          )

{
  ulong uVar1;
  iterator iVar2;
  uint uVar3;
  uint uVar4;
  size_t byte_index;
  ulong uVar5;
  uint32_t word;
  uint local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c = 0;
  uVar1 = input->_M_string_length;
  uVar5 = 0;
  do {
    uVar3 = 0;
    if (uVar5 < uVar1) {
      uVar3 = (uint)(byte)(input->_M_dataplus)._M_p[uVar5];
    }
    uVar4 = (uint)uVar5 & 3;
    local_2c = uVar3 << (char)uVar4 * '\b' | local_2c;
    if (uVar4 == 3) {
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar2
                   ,&local_2c);
      }
      else {
        *iVar2._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_2c = 0;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 <= uVar1);
  if (((int)uVar1 + 1U & 3) != 0) {
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar2,
                 &local_2c);
    }
    else {
      *iVar2._M_current = local_2c;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint32_t> MakeVector(const std::string& input) {
  std::vector<uint32_t> result;
  AppendToVector(input, &result);
  return result;
}